

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

var * __thiscall cs::domain_manager::get_var(domain_manager *this,string *name)

{
  stack_pointer psVar1;
  domain_type *pdVar2;
  bool bVar3;
  var *pvVar4;
  runtime_error *this_00;
  domain_type *domain;
  domain_type *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  psVar1 = *this->fiber_stack;
  if (psVar1 == (stack_pointer)0x0) {
LAB_001897b2:
    pdVar2 = (this->m_data).m_start;
    this_01 = (this->m_data).m_current;
    do {
      if (this_01 == pdVar2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::operator+(&bStack_68,"Use of undefined variable \"",name);
        std::operator+(&local_48,&bStack_68,"\".");
        runtime_error::runtime_error(this_00,&local_48);
        __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      this_01 = this_01 + -1;
      bVar3 = domain_type::exist(this_01,name);
    } while (!bVar3);
  }
  else {
    pdVar2 = psVar1->m_start;
    this_01 = psVar1->m_current;
    do {
      if (this_01 == pdVar2) goto LAB_001897b2;
      this_01 = this_01 + -1;
      bVar3 = domain_type::exist(this_01,name);
    } while (!bVar3);
  }
  pvVar4 = domain_type::get_var_no_check(this_01,name);
  return pvVar4;
}

Assistant:

inline var &get_var(const std::string &name)
		{
			if (fiber_stack != nullptr) {
				for (auto &domain: *fiber_stack)
					if (domain.exist(name))
						return domain.get_var_no_check(name);
			}
			for (auto &domain: m_data)
				if (domain.exist(name))
					return domain.get_var_no_check(name);
			throw runtime_error("Use of undefined variable \"" + name + "\".");
		}